

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base*>,phmap::priv::HashEq<cs::method_base*,void>::Hash,phmap::priv::HashEq<cs::method_base*,void>::Eq,std::allocator<cs::method_base*>>
::erase<cs::method_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *this,key_arg<cs::method_base_*> *key)

{
  bool bVar1;
  ctrl_t *in_RSI;
  anon_union_8_1_a8a14541_for_iterator_1 in_RDI;
  iterator iVar2;
  iterator it;
  key_arg<cs::method_base_*> *in_stack_ffffffffffffffb8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *in_stack_ffffffffffffffc0;
  iterator local_38;
  anon_union_8_1_a8a14541_for_iterator_1 this_00;
  ulong local_8;
  
  iVar2 = find<cs::method_base*>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = iVar2.field_1;
  local_38 = raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
             ::end((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                    *)0x54c6a6);
  bVar1 = priv::operator==((iterator *)&stack0xffffffffffffffd8,&local_38);
  if (!bVar1) {
    iVar2.field_1.slot_ = in_RDI.slot_;
    iVar2.ctrl_ = in_RSI;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
    ::_erase((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
              *)this_00.slot_,iVar2);
  }
  local_8 = (ulong)!bVar1;
  return local_8;
}

Assistant:

size_type erase(const key_arg<K>& key)
			{
				auto it = find(key);
				if (it == end()) return 0;
				_erase(it);
				return 1;
			}